

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModelValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)556>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  LinkedModel *pLVar3;
  LinkedModelFile *from;
  size_type sVar4;
  _Alloc_hider _Var5;
  ModelDescription *interface;
  Result result;
  LinkedModelFile linkedFileSpec;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  undefined1 local_78 [24];
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  undefined1 local_50 [24];
  string local_38;
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] == 0x22c) {
    if (format->isupdatable_ != true) {
      Result::Result((Result *)local_88);
      validateModelDescription((Result *)local_60,interface,format->specificationversion_);
      local_88 = local_60;
      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_58);
      if (local_58._M_p != local_50 + 8) {
        operator_delete(local_58._M_p,local_50._8_8_ + 1);
      }
      bVar2 = Result::good((Result *)local_88);
      if (bVar2) {
        if (format->_oneof_case_[0] == 0x22c) {
          pLVar3 = (LinkedModel *)(format->Type_).treeensembleregressor_;
        }
        else {
          pLVar3 = Specification::LinkedModel::default_instance();
        }
        if (pLVar3->_oneof_case_[0] == 0) {
          local_60 = (undefined1  [8])local_50;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_60,"LinkedModel.LinkType not set.","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
          if (local_60 != (undefined1  [8])local_50) {
            operator_delete((void *)local_60,local_50._0_8_ + 1);
          }
        }
        else {
          if (format->_oneof_case_[0] == 0x22c) {
            pLVar3 = (LinkedModel *)(format->Type_).treeensembleregressor_;
          }
          else {
            pLVar3 = Specification::LinkedModel::default_instance();
          }
          if (pLVar3->_oneof_case_[0] == 1) {
            from = (pLVar3->LinkType_).linkedmodelfile_;
          }
          else {
            from = Specification::LinkedModelFile::default_instance();
          }
          Specification::LinkedModelFile::LinkedModelFile((LinkedModelFile *)local_60,from);
          if ((undefined8 *)local_50._0_8_ == (undefined8 *)0x0) {
            local_50._0_8_ = &Specification::_StringParameter_default_instance_;
          }
          if (*(long *)(*(long *)(local_50._0_8_ + 0x10) + 8) == 0) {
            local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_38,
                       "LinkedModel.linkedModelFile.linkedModeFileName.defaultValue cannot be empty."
                       ,"");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_38._M_dataplus._M_p != &local_38.field_2) {
              operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            __return_storage_ptr__->m_type = local_88._0_4_;
            __return_storage_ptr__->m_reason = local_88._4_4_;
            paVar1 = &(__return_storage_ptr__->m_message).field_2;
            (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
            if (local_80._M_p == local_78 + 8) {
              paVar1->_M_allocated_capacity = CONCAT71(local_78._9_7_,local_78[8]);
              *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                   local_78._16_8_;
            }
            else {
              (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_80._M_p;
              (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                   CONCAT71(local_78._9_7_,local_78[8]);
            }
            (__return_storage_ptr__->m_message)._M_string_length = local_78._0_8_;
            local_78._0_8_ = 0;
            local_78[8] = '\0';
            local_80._M_p = local_78 + 8;
          }
          Specification::LinkedModelFile::~LinkedModelFile((LinkedModelFile *)local_60);
        }
      }
      else {
        __return_storage_ptr__->m_type = local_88._0_4_;
        __return_storage_ptr__->m_reason = local_88._4_4_;
        paVar1 = &(__return_storage_ptr__->m_message).field_2;
        (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
        if (local_80._M_p == local_78 + 8) {
          paVar1->_M_allocated_capacity = CONCAT71(local_78._9_7_,local_78[8]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_78._16_8_;
        }
        else {
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_80._M_p;
          (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
               CONCAT71(local_78._9_7_,local_78[8]);
        }
        (__return_storage_ptr__->m_message)._M_string_length = local_78._0_8_;
        local_78._0_8_ = 0;
        local_78[8] = '\0';
        local_80._M_p = local_78 + 8;
      }
      if (local_80._M_p == local_78 + 8) {
        return __return_storage_ptr__;
      }
      sVar4 = CONCAT71(local_78._9_7_,local_78[8]);
      _Var5._M_p = local_80._M_p;
      goto LAB_0027cb0b;
    }
    local_88 = (undefined1  [8])local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"LinkedModel cannot be marked as updatable","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
  }
  else {
    local_88 = (undefined1  [8])local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Model not an a LinkedModel.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
  }
  sVar4 = local_78._0_8_;
  _Var5._M_p = (pointer)local_88;
  if (local_88 == (undefined1  [8])local_78) {
    return __return_storage_ptr__;
  }
LAB_0027cb0b:
  operator_delete(_Var5._M_p,sVar4 + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_linkedModel>(const Specification::Model& format) {
        const auto& interface = format.description();

        // Make sure that if there is a double output type, there is exactly one output index selected.
        if (!format.has_linkedmodel()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Model not an a LinkedModel.");
        }

        if (format.isupdatable()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "LinkedModel cannot be marked as updatable");
        }
        
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        if (format.linkedmodel().LinkType_case() == Specification::LinkedModel::LINKTYPE_NOT_SET) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "LinkedModel.LinkType not set.");
        }

        auto linkedFileSpec = format.linkedmodel().linkedmodelfile();
        if (linkedFileSpec.linkedmodelfilename().defaultvalue().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "LinkedModel.linkedModelFile.linkedModeFileName.defaultValue cannot be empty.");
        }

        if (linkedFileSpec.linkedmodelsearchpath().defaultvalue().empty()) {
            // This is allowed and is the same as having "." or "./" as search path
        }

        return result;
    }